

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  reference __rhs;
  bool collapse;
  string local_6a8 [32];
  string local_688;
  undefined1 local_668 [8];
  ostringstream cmCPackLog_msg_2;
  string local_4f0;
  string local_4d0 [32];
  undefined1 local_4b0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_338 [8];
  string rp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  const_iterator fileIt;
  string local_2f0;
  char *local_2d0;
  char *installPrefix;
  string local_2c0;
  allocator local_299;
  string local_298;
  undefined1 local_278 [8];
  string filePrefix;
  string dir;
  allocator local_212;
  allocator local_211;
  string local_210;
  undefined1 local_1f0 [8];
  string localToplevel;
  ostringstream local_1a0 [8];
  ostringstream cmCPackLog_msg;
  cmCPackComponent *component_local;
  cmArchiveWrite *archive_local;
  cmCPackArchiveGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"   - packaging component: ");
  poVar3 = std::operator<<(poVar3,(string *)component);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x34,pcVar4);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"CPACK_TEMPORARY_DIRECTORY",&local_211);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1f0,pcVar4,&local_212);
  std::allocator<char>::~allocator((allocator<char> *)&local_212);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dir.field_2 + 8),"/",&component->Name);
  std::__cxx11::string::operator+=((string *)local_1f0,(string *)(dir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)((long)&filePrefix.field_2 + 8),(SystemTools *)0x1,collapse);
  cmsys::SystemTools::ChangeDirectory((string *)local_1f0);
  std::__cxx11::string::string((string *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_298,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",&local_299);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2c0,"CPACK_PACKAGE_FILE_NAME",
               (allocator *)((long)&installPrefix + 7));
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2c0);
    std::__cxx11::string::operator=((string *)local_278,pcVar4);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    std::__cxx11::string::operator+=((string *)local_278,"/");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f0,"CPACK_PACKAGING_INSTALL_PREFIX",
             (allocator *)((long)&fileIt._M_current + 7));
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 7));
  local_2d0 = pcVar4;
  if (((pcVar4 != (char *)0x0) && (*pcVar4 == '/')) && (pcVar4[1] != '\0')) {
    std::__cxx11::string::operator+=((string *)local_278,pcVar4 + 1);
    std::__cxx11::string::operator+=((string *)local_278,"/");
  }
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_300);
  local_310._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&component->Files);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_308,&local_310);
  local_300._M_current = local_308;
  while( true ) {
    rp.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&component->Files);
    bVar2 = __gnu_cxx::operator!=
                      (&local_300,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&rp.field_2 + 8));
    if (!bVar2) break;
    __rhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_300);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   __rhs);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    poVar3 = std::operator<<((ostream *)local_4b0,"Adding file: ");
    poVar3 = std::operator<<(poVar3,(string *)local_338);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x4f,pcVar4);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::__cxx11::string::string((string *)&local_4f0,(string *)local_338);
    cmArchiveWrite::Add(archive,&local_4f0,0,(char *)0x0,false);
    std::__cxx11::string::~string((string *)&local_4f0);
    bVar2 = cmArchiveWrite::operator!(archive);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
      poVar3 = std::operator<<((ostream *)local_668,"ERROR while packaging files: ");
      cmArchiveWrite::GetError_abi_cxx11_(&local_688,archive);
      poVar3 = std::operator<<(poVar3,(string *)&local_688);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_688);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x55,pcVar4);
      std::__cxx11::string::~string(local_6a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
      this_local._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_338);
    if (bVar2) goto LAB_004ba9d5;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_300);
  }
  cmsys::SystemTools::ChangeDirectory((string *)((long)&filePrefix.field_2 + 8));
  this_local._4_4_ = 1;
LAB_004ba9d5:
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(filePrefix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1f0);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(cmArchiveWrite& archive,
                             cmCPackComponent* component)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "   - packaging component: "
      << component->Name
      << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/"+ component->Name;
  std::string dir = cmSystemTools::GetCurrentWorkingDirectory();
  // Change to local toplevel
  cmSystemTools::ChangeDirectory(localToplevel);
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY"))
    {
    filePrefix = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    filePrefix += "/";
    }
  const char* installPrefix =
    this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if(installPrefix && installPrefix[0] == '/' && installPrefix[1] != 0)
    {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix+1;
    filePrefix += "/";
    }
  std::vector<std::string>::const_iterator fileIt;
  for (fileIt = component->Files.begin(); fileIt != component->Files.end();
       ++fileIt )
    {
    std::string rp = filePrefix + *fileIt;
    cmCPackLogger(cmCPackLog::LOG_DEBUG,"Adding file: "
                  << rp << std::endl);
    archive.Add(rp, 0, 0, false);
    if (!archive)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "ERROR while packaging files: "
            << archive.GetError()
            << std::endl);
      return 0;
      }
    }
  // Go back to previous dir
  cmSystemTools::ChangeDirectory(dir);
  return 1;
}